

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

void __thiscall ncnn::Split::Split(Split *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Layer_001799b8;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->super_Layer).support_vulkan = true;
  (this->super_Layer).support_packing = true;
  (this->super_Layer).support_bf16_storage = true;
  return;
}

Assistant:

Split::Split()
{
    one_blob_only = false;
    support_inplace = false;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
}